

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O2

void __thiscall Grid::setup_neighbours(Grid *this)

{
  int *piVar1;
  GridNode *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int newY;
  int iVar11;
  int iVar12;
  int newX;
  int iVar13;
  GridNode *local_38;
  
  iVar5 = 0;
  while (iVar9 = iVar5, iVar9 < this->rows) {
    iVar4 = 1;
    if (1 < iVar9) {
      iVar4 = iVar9;
    }
    iVar5 = iVar9 + 1;
    iVar8 = 0;
    while (iVar12 = iVar8, iVar10 = this->columns, iVar12 < iVar10) {
      pGVar2 = this->nodes;
      iVar6 = iVar10 * iVar9 + iVar12;
      iVar7 = 1;
      if (1 < iVar12) {
        iVar7 = iVar12;
      }
      iVar8 = iVar12 + 1;
      iVar3 = iVar10 + -1;
      if (iVar8 < iVar10 + -1) {
        iVar3 = iVar8;
      }
      iVar10 = this->rows + -1;
      iVar11 = iVar4 + -1;
      if (this->rows < iVar9) {
        iVar11 = iVar10;
      }
      if (iVar5 < iVar10) {
        iVar10 = iVar5;
      }
      for (; iVar13 = iVar7 + -1, iVar11 <= iVar10; iVar11 = iVar11 + 1) {
        for (; iVar13 <= iVar3; iVar13 = iVar13 + 1) {
          if (iVar12 != iVar13 || iVar11 != iVar9) {
            local_38 = this->nodes + (this->columns * iVar11 + iVar13);
            std::vector<GridNode*,std::allocator<GridNode*>>::emplace_back<GridNode*>
                      ((vector<GridNode*,std::allocator<GridNode*>> *)&pGVar2[iVar6].neighbours,
                       &local_38);
            piVar1 = &pGVar2[iVar6].neighbourCount;
            *piVar1 = *piVar1 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void setup_neighbours()
    {
        for (int y = 0; y < rows; y++)
        {
            for (int x = 0; x < columns; x++)
            {
                GridNode *node = get_node_from_position(x, y);
                int startX = clamp(x - 1, 0, columns - 1);
                int endX = clamp(x + 1, 0, columns - 1);
                int startY = clamp(y - 1, 0, rows - 1);
                int endY = clamp(y + 1, 0, rows - 1);
                for (int newY = startY; newY <= endY; newY++)
                {
                    for (int newX = startX; newX <= endX; newX++)
                    {

                        if (newX != x || newY != y)
                        {
#if DIAGONAL_DISABLED
                            if (newX == x || newY == y)
                            {
                                node->neighbours.push_back(get_node_from_position(newX, newY));
                                node->neighbourCount++;
                            }
#else
                            node->neighbours.push_back(get_node_from_position(newX, newY));
                            node->neighbourCount++;
#endif
                        }
                    }
                }
            }
        }
    }